

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void first_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int *accum_aux_local;
  int *accum_local;
  int *auxs_local;
  int *vals_local;
  int n_local;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    *accum_aux = 0x7ffffffe;
  }
  else {
    *accum = *vals;
    *accum_aux = *auxs;
  }
  return;
}

Assistant:

static void first_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	if (n > 0) {
		*accum = vals[0];
		*accum_aux = auxs[0];
	} else {
		*accum = UI_ENTRY_VALUE_NOT_PRESENT;
		*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	}
}